

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O1

void Frc_ManCreateRefsSpecial(Gia_Man_t *p)

{
  undefined1 *puVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  Gia_Obj_t *pObjD1;
  Gia_Obj_t *pObjD0;
  Gia_Obj_t *local_40;
  Gia_Obj_t *local_38;
  
  if (p->pRefs != (int *)0x0) {
    __assert_fail("p->pRefs == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaForce.c"
                  ,0x13e,"void Frc_ManCreateRefsSpecial(Gia_Man_t *)");
  }
  Gia_ManCleanMark0(p);
  Gia_ManCreateRefs(p);
  uVar7 = p->nObjs;
  if ((0 < (int)uVar7) && (pGVar6 = p->pObjs, pGVar6 != (Gia_Obj_t *)0x0)) {
    lVar10 = 0;
    do {
      uVar9 = *(ulong *)pGVar6;
      uVar8 = uVar9 & 0x1fffffff;
      if (uVar8 != 0x1fffffff && -1 < (int)(uint)uVar9) {
        if (((uint)uVar9 >> 0x1e & 1) != 0) {
          __assert_fail("pObj->fMark0 == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaForce.c"
                        ,0x143,"void Frc_ManCreateRefsSpecial(Gia_Man_t *)");
        }
        if ((((byte)(*(uint *)(pGVar6 + -uVar8) >> 0x1e) & 1) == 0 &&
             (*(uint *)(pGVar6 + -uVar8) & 0x9fffffff) != 0x9fffffff) &&
           (uVar7 = *(uint *)(pGVar6 + -(ulong)((uint)(uVar9 >> 0x20) & 0x1fffffff)),
           ((byte)(uVar7 >> 0x1e) & 1) == 0 && (uVar7 & 0x9fffffff) != 0x9fffffff)) {
          iVar4 = Gia_ObjIsMuxType(pGVar6);
          if (iVar4 != 0) {
            pGVar6->field_0x3 = pGVar6->field_0x3 | 0x40;
            pGVar6[-uVar8].field_0x3 = pGVar6[-uVar8].field_0x3 | 0x40;
            puVar1 = &pGVar6[-(ulong)((uint)(uVar9 >> 0x20) & 0x1fffffff)].field_0x3;
            *puVar1 = *puVar1 | 0x40;
            pGVar5 = Gia_ObjRecognizeMux(pGVar6,&local_40,&local_38);
            pGVar5 = (Gia_Obj_t *)((ulong)pGVar5 & 0xfffffffffffffffe);
            pGVar6 = p->pObjs;
            if ((pGVar5 < pGVar6) || (pGVar6 + p->nObjs <= pGVar5)) {
LAB_006d868b:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            piVar3 = p->pRefs;
            piVar2 = piVar3 + (int)((ulong)((long)pGVar5 - (long)pGVar6) >> 2) * -0x55555555;
            *piVar2 = *piVar2 + -1;
            pGVar5 = (Gia_Obj_t *)((ulong)local_38 & 0xfffffffffffffffe);
            if (pGVar5 == (Gia_Obj_t *)((ulong)local_40 & 0xfffffffffffffffe)) {
              if ((pGVar5 < pGVar6) || (pGVar6 + p->nObjs <= pGVar5)) goto LAB_006d868b;
              piVar3 = piVar3 + (int)((ulong)((long)pGVar5 - (long)pGVar6) >> 2) * -0x55555555;
              *piVar3 = *piVar3 + -1;
            }
          }
        }
      }
      lVar10 = lVar10 + 1;
      uVar7 = p->nObjs;
    } while ((lVar10 < (int)uVar7) && (pGVar6 = p->pObjs + lVar10, p->pObjs != (Gia_Obj_t *)0x0));
  }
  if ((0 < (int)uVar7) && (pGVar6 = p->pObjs, pGVar6 != (Gia_Obj_t *)0x0)) {
    uVar9 = 0;
    do {
      if (((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) &&
         (p->pRefs[uVar9] < 1)) {
        __assert_fail("Gia_ObjRefNum(p, pObj) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaForce.c"
                      ,0x158,"void Frc_ManCreateRefsSpecial(Gia_Man_t *)");
      }
      uVar9 = uVar9 + 1;
      pGVar6 = pGVar6 + 1;
    } while (uVar7 != uVar9);
  }
  Gia_ManCleanMark0(p);
  return;
}

Assistant:

void Frc_ManCreateRefsSpecial( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj, * pFan0, * pFan1;
    Gia_Obj_t * pObjC, * pObjD0, * pObjD1;
    int i;
    assert( p->pRefs == NULL );
    Gia_ManCleanMark0( p );
    Gia_ManCreateRefs( p );
    Gia_ManForEachAnd( p, pObj, i )
    {
        assert( pObj->fMark0 == 0 );
        pFan0 = Gia_ObjFanin0(pObj);
        pFan1 = Gia_ObjFanin1(pObj);
        // skip nodes whose fanins are PIs or are already marked
        if ( Gia_ObjIsCi(pFan0) || pFan0->fMark0 || 
             Gia_ObjIsCi(pFan1) || pFan1->fMark0 )
             continue;
        // skip nodes that are not MUX type
        if ( !Gia_ObjIsMuxType(pObj) )
            continue;
        // the node is MUX type, mark it and its fanins
        pObj->fMark0  = 1;
        pFan0->fMark0 = 1;
        pFan1->fMark0 = 1;
        // deref the control 
        pObjC = Gia_ObjRecognizeMux( pObj, &pObjD1, &pObjD0 );
        Gia_ObjRefDec( p, Gia_Regular(pObjC) );
        if ( Gia_Regular(pObjD0) == Gia_Regular(pObjD1) )
            Gia_ObjRefDec( p, Gia_Regular(pObjD0) );
    }
    Gia_ManForEachAnd( p, pObj, i )
        assert( Gia_ObjRefNum(p, pObj) > 0 );
    Gia_ManCleanMark0( p );
}